

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

void __thiscall soul::CodeLocation::CodeLocation(CodeLocation *this,Ptr *code)

{
  SourceCodeText *pSVar1;
  Ptr *code_local;
  CodeLocation *this_local;
  
  RefCountedPtr<soul::SourceCodeText>::RefCountedPtr(&this->sourceCode,code);
  pSVar1 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
  UTF8Reader::UTF8Reader(&this->location,&pSVar1->utf8);
  return;
}

Assistant:

CodeLocation::CodeLocation (SourceCodeText::Ptr code)  : sourceCode (std::move (code)), location (sourceCode->utf8) {}